

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_statistics.cpp
# Opt level: O1

Value * duckdb::ParquetStatisticsUtils::ConvertValueInternal
                  (Value *__return_storage_ptr__,LogicalType *type,ParquetColumnSchema *schema_ele,
                  string *stats)

{
  PhysicalType PVar1;
  ParquetExtraTypeInfo PVar2;
  double *pointer;
  pointer pcVar3;
  uint8_t width;
  uint8_t scale;
  bool bVar4;
  short value;
  int iVar5;
  int32_t value_00;
  idx_t i;
  timestamp_tz_t value_01;
  long lVar6;
  timestamp_ns_t timestamp;
  dtime_tz_t value_02;
  InternalException *this;
  InvalidInputException *pIVar7;
  NotImplementedException *this_00;
  uint *puVar8;
  ulong uVar9;
  Value *this_01;
  dtime_t value_03;
  LogicalType *this_02;
  float value_04;
  double dVar10;
  hugeint_t hVar11;
  string_t blob;
  long val;
  string local_140;
  double local_120;
  uint local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  double local_108;
  string local_100;
  LogicalType local_e0;
  LogicalType local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (0x2c < type->id_ - 10) {
switchD_01b8a5f7_caseD_11:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_140,"Unsupported type for stats %s","");
    LogicalType::ToString_abi_cxx11_(&local_b0,type);
    InternalException::InternalException<std::__cxx11::string>(this,&local_140,&local_b0);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pointer = (double *)(stats->_M_dataplus)._M_p;
  puVar8 = &switchD_01b8a5f7::switchdataD_01e61154;
  switch((uint)type->id_) {
  case 10:
    if (stats->_M_string_length != 1) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,"Incorrect stats size for type BOOLEAN","");
      InvalidInputException::InvalidInputException(pIVar7,&local_140);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Value::BOOLEAN(__return_storage_ptr__,(bool)(*(byte *)pointer & 1));
    break;
  case 0xb:
  case 0xc:
  case 0xd:
    if (stats->_M_string_length != 4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,"Incorrect stats size for type INTEGER","");
      InvalidInputException::InvalidInputException(pIVar7,&local_140);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Value::INTEGER(__return_storage_ptr__,*(int32_t *)pointer);
    break;
  case 0xe:
    if (stats->_M_string_length != 8) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,"Incorrect stats size for type BIGINT","");
      InvalidInputException::InvalidInputException(pIVar7,&local_140);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Value::BIGINT(__return_storage_ptr__,(int64_t)*pointer);
    break;
  case 0xf:
    if (stats->_M_string_length != 4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,"Incorrect stats size for type DATE","");
      InvalidInputException::InvalidInputException(pIVar7,&local_140);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Value::DATE(__return_storage_ptr__,(date_t)*(int32_t *)pointer);
    break;
  case 0x10:
    if (stats->_M_string_length == 8) {
      value_03.micros = (int64_t)*pointer;
    }
    else {
      if (stats->_M_string_length != 4) {
        pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"Incorrect stats size for type TIME","");
        InvalidInputException::InvalidInputException(pIVar7,&local_140);
        __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      value_03.micros = (int64_t)*(int *)pointer;
    }
    if (schema_ele->type_info == UNIT_NS) {
      value_03 = Time::FromTimeNs(value_03.micros);
    }
    else if (schema_ele->type_info == UNIT_MS) {
      value_03 = Time::FromTimeMs(value_03.micros);
    }
    Value::TIME(__return_storage_ptr__,value_03);
    break;
  default:
    goto switchD_01b8a5f7_caseD_11;
  case 0x13:
  case 0x20:
    PVar2 = schema_ele->type_info;
    if (PVar2 == IMPALA_TIMESTAMP) {
      if (stats->_M_string_length != 0xc) {
        pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"Incorrect stats size for type TIMESTAMP","");
        InvalidInputException::InvalidInputException(pIVar7,&local_140);
        __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_140._M_dataplus._M_p = (pointer)*pointer;
      local_140._M_string_length._0_4_ = *(undefined4 *)(pointer + 1);
      value_01.super_timestamp_t = ImpalaTimestampToTimestamp((Int96 *)&local_140);
    }
    else {
      if (stats->_M_string_length != 8) {
        pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"Incorrect stats size for type TIMESTAMP","");
        InvalidInputException::InvalidInputException(pIVar7,&local_140);
        __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      value_01.super_timestamp_t.value = (timestamp_t)*pointer;
      if (PVar2 == UNIT_NS) {
        value_01.super_timestamp_t =
             Timestamp::FromEpochNanoSeconds((int64_t)value_01.super_timestamp_t.value);
      }
      else if (PVar2 == UNIT_MS) {
        value_01.super_timestamp_t =
             Timestamp::FromEpochMs((int64_t)value_01.super_timestamp_t.value);
      }
    }
    if (type->id_ == TIMESTAMP_TZ) {
      Value::TIMESTAMPTZ(__return_storage_ptr__,value_01);
    }
    else {
      Value::TIMESTAMP(__return_storage_ptr__,value_01.super_timestamp_t.value);
    }
    break;
  case 0x14:
    PVar2 = schema_ele->type_info;
    if (PVar2 == IMPALA_TIMESTAMP) {
      if (stats->_M_string_length != 0xc) {
        pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"Incorrect stats size for type TIMESTAMP_NS","");
        InvalidInputException::InvalidInputException(pIVar7,&local_140);
        __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_140._M_dataplus._M_p = (pointer)*pointer;
      local_140._M_string_length._0_4_ = *(undefined4 *)(pointer + 1);
      timestamp = ImpalaTimestampToTimestampNS((Int96 *)&local_140);
    }
    else {
      if (stats->_M_string_length != 8) {
        pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"Incorrect stats size for type TIMESTAMP_NS","");
        InvalidInputException::InvalidInputException(pIVar7,&local_140);
        __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_140._M_dataplus._M_p = (pointer)*pointer;
      if (PVar2 == UNIT_NS) {
        timestamp = ParquetTimestampNsToTimestampNs((int64_t *)&local_140);
      }
      else if (PVar2 == UNIT_MS) {
        timestamp = ParquetTimestampMsToTimestampNs((int64_t *)&local_140);
      }
      else {
        timestamp = ParquetTimestampUsToTimestampNs((int64_t *)&local_140);
      }
    }
    Value::TIMESTAMPNS(__return_storage_ptr__,timestamp);
    break;
  case 0x15:
    width = DecimalType::GetWidth(type);
    scale = DecimalType::GetScale(type);
    PVar2 = schema_ele->type_info;
    if (PVar2 == DECIMAL_BYTE_ARRAY) {
      PVar1 = type->physical_type_;
      if (UINT64 < PVar1) {
        if (PVar1 == INT64) {
          dVar10 = (double)ParquetDecimalUtils::ReadDecimalValue<long>
                                     ((const_data_ptr_t)pointer,stats->_M_string_length,schema_ele);
          goto LAB_01b8ac06;
        }
        if (PVar1 == INT128) {
          hVar11 = ParquetDecimalUtils::ReadDecimalValue<duckdb::hugeint_t>
                             ((const_data_ptr_t)pointer,stats->_M_string_length,schema_ele);
          Value::DECIMAL(__return_storage_ptr__,hVar11,width,scale);
          return __return_storage_ptr__;
        }
LAB_01b8b384:
        pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"Unsupported internal type for decimal","");
        InvalidInputException::InvalidInputException(pIVar7,&local_140);
        __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (PVar1 == INT16) {
        value = ParquetDecimalUtils::ReadDecimalValue<short>
                          ((const_data_ptr_t)pointer,stats->_M_string_length,schema_ele);
        Value::DECIMAL(__return_storage_ptr__,value,width,scale);
        return __return_storage_ptr__;
      }
      if (PVar1 != INT32) goto LAB_01b8b384;
      value_00 = ParquetDecimalUtils::ReadDecimalValue<int>
                           ((const_data_ptr_t)pointer,stats->_M_string_length,schema_ele);
    }
    else {
      if (PVar2 == DECIMAL_INT64) {
        if (stats->_M_string_length != 8) {
          pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_140,"Incorrect stats size for type %s","");
          LogicalType::ToString_abi_cxx11_(&local_70,type);
          InvalidInputException::InvalidInputException<std::__cxx11::string>
                    (pIVar7,&local_140,&local_70);
          __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        dVar10 = *pointer;
LAB_01b8ac06:
        Value::DECIMAL(__return_storage_ptr__,(int64_t)dVar10,width,scale);
        return __return_storage_ptr__;
      }
      if (PVar2 != DECIMAL_INT32) {
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"Unrecognized Parquet type for Decimal","");
        NotImplementedException::NotImplementedException(this_00,&local_140);
        __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      if (stats->_M_string_length != 4) {
        pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"Incorrect stats size for type %s","");
        LogicalType::ToString_abi_cxx11_(&local_50,type);
        InvalidInputException::InvalidInputException<std::__cxx11::string>
                  (pIVar7,&local_140,&local_50);
        __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      value_00 = *(int32_t *)pointer;
    }
    Value::DECIMAL(__return_storage_ptr__,value_00,width,scale);
    break;
  case 0x16:
    if (schema_ele->type_info == FLOAT16) {
      if (stats->_M_string_length != 2) {
        pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"Incorrect stats size for type FLOAT16","");
        InvalidInputException::InvalidInputException(pIVar7,&local_140);
        __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_140._M_dataplus._M_p._0_2_ = *(undefined2 *)pointer;
      value_04 = Float16ToFloat32((uint16_t *)&local_140);
    }
    else {
      if (stats->_M_string_length != 4) {
        pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"Incorrect stats size for type FLOAT","");
        InvalidInputException::InvalidInputException(pIVar7,&local_140);
        __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      value_04 = *(float *)pointer;
    }
    local_120 = (double)CONCAT44(local_120._4_4_,value_04);
    bVar4 = Value::FloatIsFinite(value_04);
    if (bVar4) {
      Value::FLOAT(__return_storage_ptr__,local_120._0_4_);
      return __return_storage_ptr__;
    }
    LogicalType::LogicalType(&local_c8,SQLNULL);
    Value::Value(__return_storage_ptr__,&local_c8);
    this_02 = &local_c8;
LAB_01b8ab6d:
    LogicalType::~LogicalType(this_02);
    break;
  case 0x17:
    if (schema_ele->type_info == DECIMAL_BYTE_ARRAY) {
      dVar10 = ParquetDecimalUtils::ReadDecimalValue<double>
                         ((const_data_ptr_t)pointer,stats->_M_string_length,schema_ele);
    }
    else {
      if (stats->_M_string_length != 8) {
        pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"Incorrect stats size for type DOUBLE","");
        InvalidInputException::InvalidInputException(pIVar7,&local_140);
        __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_120 = *pointer;
      bVar4 = Value::DoubleIsFinite(local_120);
      dVar10 = local_120;
      if (!bVar4) {
        LogicalType::LogicalType(&local_e0,SQLNULL);
        Value::Value(__return_storage_ptr__,&local_e0);
        this_02 = &local_e0;
        goto LAB_01b8ab6d;
      }
    }
    Value::DOUBLE(__return_storage_ptr__,dVar10);
    break;
  case 0x19:
    bVar4 = Value::StringIsValid((char *)pointer,stats->_M_string_length);
    if (!bVar4) goto switchD_01b8a5f7_caseD_1a;
    pcVar3 = (stats->_M_dataplus)._M_p;
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,pcVar3,pcVar3 + stats->_M_string_length);
    Value::Value(__return_storage_ptr__,&local_100);
    local_90._M_dataplus._M_p = local_100._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == &local_100.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_01b8a947;
  case 0x1a:
switchD_01b8a5f7_caseD_1a:
    pcVar3 = (stats->_M_dataplus)._M_p;
    local_118 = (uint)stats->_M_string_length;
    if (local_118 < 0xd) {
      uStack_10c = 0;
      uStack_114 = 0;
      uStack_110 = 0;
      if (local_118 != 0) {
        switchD_015ff80e::default(&uStack_114,pcVar3,(ulong)(local_118 & 0xf));
      }
    }
    else {
      uStack_114 = *(undefined4 *)pcVar3;
      uStack_110 = SUB84(pcVar3,0);
      uStack_10c = (undefined4)((ulong)pcVar3 >> 0x20);
    }
    blob.value._4_1_ = (undefined1)uStack_10c;
    blob.value._5_1_ = uStack_10c._1_1_;
    blob.value._6_1_ = uStack_10c._2_1_;
    blob.value._7_1_ = uStack_10c._3_1_;
    blob.value.pointer.length = uStack_110;
    blob.value.pointer.ptr = (char *)puVar8;
    Blob::ToString_abi_cxx11_(&local_90,(Blob *)CONCAT44(uStack_114,local_118),blob);
    Value::Value(__return_storage_ptr__,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
LAB_01b8a947:
    operator_delete(local_90._M_dataplus._M_p);
    break;
  case 0x1c:
  case 0x1d:
  case 0x1e:
    if (stats->_M_string_length != 4) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,"Incorrect stats size for type UINTEGER","");
      InvalidInputException::InvalidInputException(pIVar7,&local_140);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Value::UINTEGER(__return_storage_ptr__,*(uint32_t *)pointer);
    break;
  case 0x1f:
    if (stats->_M_string_length != 8) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,"Incorrect stats size for type UBIGINT","");
      InvalidInputException::InvalidInputException(pIVar7,&local_140);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Value::UBIGINT(__return_storage_ptr__,(uint64_t)*pointer);
    break;
  case 0x22:
    if (stats->_M_string_length == 8) {
      local_108 = *pointer;
    }
    else {
      if (stats->_M_string_length != 4) {
        pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"Incorrect stats size for type TIMETZ","");
        InvalidInputException::InvalidInputException(pIVar7,&local_140);
        __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_108 = (double)(long)*(int *)pointer;
    }
    if (schema_ele->type_info == UNIT_NS) {
      value_02 = ParquetIntToTimeNsTZ((int64_t *)&local_108);
    }
    else if (schema_ele->type_info == UNIT_MS) {
      iVar5 = NumericCastImpl<int,_long,_false>::Convert((long)local_108);
      local_140._M_dataplus._M_p._0_4_ = iVar5;
      value_02 = ParquetIntToTimeMsTZ((int32_t *)&local_140);
    }
    else {
      value_02 = ParquetIntToTimeTZ((int64_t *)&local_108);
    }
    Value::TIMETZ(__return_storage_ptr__,value_02);
    break;
  case 0x36:
    if (stats->_M_string_length != 0x10) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_140,"Incorrect stats size for type UUID","");
      InvalidInputException::InvalidInputException(pIVar7,&local_140);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    lVar6 = 0;
    uVar9 = 0;
    do {
      uVar9 = (ulong)*(byte *)((long)pointer + lVar6) | uVar9 << 8;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    lVar6 = 0;
    this_01 = (Value *)0x0;
    do {
      hVar11.upper = (long)this_01 << 8;
      this_01 = (Value *)(*(byte *)((long)pointer + lVar6 + 8) | hVar11.upper);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    hVar11.lower = uVar9 ^ 0x8000000000000000;
    Value::UUID(__return_storage_ptr__,this_01,hVar11);
  }
  return __return_storage_ptr__;
}

Assistant:

Value ParquetStatisticsUtils::ConvertValueInternal(const LogicalType &type, const ParquetColumnSchema &schema_ele,
                                                   const std::string &stats) {
	auto stats_data = const_data_ptr_cast(stats.c_str());
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN: {
		if (stats.size() != sizeof(bool)) {
			throw InvalidInputException("Incorrect stats size for type BOOLEAN");
		}
		return Value::BOOLEAN(Load<bool>(stats_data));
	}
	case LogicalTypeId::UTINYINT:
	case LogicalTypeId::USMALLINT:
	case LogicalTypeId::UINTEGER:
		if (stats.size() != sizeof(uint32_t)) {
			throw InvalidInputException("Incorrect stats size for type UINTEGER");
		}
		return Value::UINTEGER(Load<uint32_t>(stats_data));
	case LogicalTypeId::UBIGINT:
		if (stats.size() != sizeof(uint64_t)) {
			throw InvalidInputException("Incorrect stats size for type UBIGINT");
		}
		return Value::UBIGINT(Load<uint64_t>(stats_data));
	case LogicalTypeId::TINYINT:
	case LogicalTypeId::SMALLINT:
	case LogicalTypeId::INTEGER:
		if (stats.size() != sizeof(int32_t)) {
			throw InvalidInputException("Incorrect stats size for type INTEGER");
		}
		return Value::INTEGER(Load<int32_t>(stats_data));
	case LogicalTypeId::BIGINT:
		if (stats.size() != sizeof(int64_t)) {
			throw InvalidInputException("Incorrect stats size for type BIGINT");
		}
		return Value::BIGINT(Load<int64_t>(stats_data));
	case LogicalTypeId::FLOAT: {
		float val;
		if (schema_ele.type_info == ParquetExtraTypeInfo::FLOAT16) {
			if (stats.size() != sizeof(uint16_t)) {
				throw InvalidInputException("Incorrect stats size for type FLOAT16");
			}
			val = Float16ToFloat32(Load<uint16_t>(stats_data));
		} else {
			if (stats.size() != sizeof(float)) {
				throw InvalidInputException("Incorrect stats size for type FLOAT");
			}
			val = Load<float>(stats_data);
		}
		if (!Value::FloatIsFinite(val)) {
			return Value();
		}
		return Value::FLOAT(val);
	}
	case LogicalTypeId::DOUBLE: {
		if (schema_ele.type_info == ParquetExtraTypeInfo::DECIMAL_BYTE_ARRAY) {
			// decimals cast to double
			return Value::DOUBLE(ParquetDecimalUtils::ReadDecimalValue<double>(stats_data, stats.size(), schema_ele));
		}
		if (stats.size() != sizeof(double)) {
			throw InvalidInputException("Incorrect stats size for type DOUBLE");
		}
		auto val = Load<double>(stats_data);
		if (!Value::DoubleIsFinite(val)) {
			return Value();
		}
		return Value::DOUBLE(val);
	}
	case LogicalTypeId::DECIMAL: {
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		switch (schema_ele.type_info) {
		case ParquetExtraTypeInfo::DECIMAL_INT32:
			if (stats.size() != sizeof(int32_t)) {
				throw InvalidInputException("Incorrect stats size for type %s", type.ToString());
			}
			return Value::DECIMAL(Load<int32_t>(stats_data), width, scale);
		case ParquetExtraTypeInfo::DECIMAL_INT64:
			if (stats.size() != sizeof(int64_t)) {
				throw InvalidInputException("Incorrect stats size for type %s", type.ToString());
			}
			return Value::DECIMAL(Load<int64_t>(stats_data), width, scale);
		case ParquetExtraTypeInfo::DECIMAL_BYTE_ARRAY:
			switch (type.InternalType()) {
			case PhysicalType::INT16:
				return Value::DECIMAL(
				    ParquetDecimalUtils::ReadDecimalValue<int16_t>(stats_data, stats.size(), schema_ele), width, scale);
			case PhysicalType::INT32:
				return Value::DECIMAL(
				    ParquetDecimalUtils::ReadDecimalValue<int32_t>(stats_data, stats.size(), schema_ele), width, scale);
			case PhysicalType::INT64:
				return Value::DECIMAL(
				    ParquetDecimalUtils::ReadDecimalValue<int64_t>(stats_data, stats.size(), schema_ele), width, scale);
			case PhysicalType::INT128:
				return Value::DECIMAL(
				    ParquetDecimalUtils::ReadDecimalValue<hugeint_t>(stats_data, stats.size(), schema_ele), width,
				    scale);
			default:
				throw InvalidInputException("Unsupported internal type for decimal");
			}
		default:
			throw NotImplementedException("Unrecognized Parquet type for Decimal");
		}
	}
	case LogicalTypeId::VARCHAR:
	case LogicalTypeId::BLOB:
		if (type.id() == LogicalTypeId::BLOB || !Value::StringIsValid(stats)) {
			return Value(Blob::ToString(string_t(stats)));
		}
		return Value(stats);
	case LogicalTypeId::DATE:
		if (stats.size() != sizeof(int32_t)) {
			throw InvalidInputException("Incorrect stats size for type DATE");
		}
		return Value::DATE(date_t(Load<int32_t>(stats_data)));
	case LogicalTypeId::TIME: {
		int64_t val;
		if (stats.size() == sizeof(int32_t)) {
			val = Load<int32_t>(stats_data);
		} else if (stats.size() == sizeof(int64_t)) {
			val = Load<int64_t>(stats_data);
		} else {
			throw InvalidInputException("Incorrect stats size for type TIME");
		}
		switch (schema_ele.type_info) {
		case ParquetExtraTypeInfo::UNIT_MS:
			return Value::TIME(Time::FromTimeMs(val));
		case ParquetExtraTypeInfo::UNIT_NS:
			return Value::TIME(Time::FromTimeNs(val));
		case ParquetExtraTypeInfo::UNIT_MICROS:
		default:
			return Value::TIME(dtime_t(val));
		}
	}
	case LogicalTypeId::TIME_TZ: {
		int64_t val;
		if (stats.size() == sizeof(int32_t)) {
			val = Load<int32_t>(stats_data);
		} else if (stats.size() == sizeof(int64_t)) {
			val = Load<int64_t>(stats_data);
		} else {
			throw InvalidInputException("Incorrect stats size for type TIMETZ");
		}
		switch (schema_ele.type_info) {
		case ParquetExtraTypeInfo::UNIT_MS:
			return Value::TIMETZ(ParquetIntToTimeMsTZ(NumericCast<int32_t>(val)));
		case ParquetExtraTypeInfo::UNIT_NS:
			return Value::TIMETZ(ParquetIntToTimeNsTZ(val));
		case ParquetExtraTypeInfo::UNIT_MICROS:
		default:
			return Value::TIMETZ(ParquetIntToTimeTZ(val));
		}
	}
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ: {
		timestamp_t timestamp_value;
		if (schema_ele.type_info == ParquetExtraTypeInfo::IMPALA_TIMESTAMP) {
			if (stats.size() != sizeof(Int96)) {
				throw InvalidInputException("Incorrect stats size for type TIMESTAMP");
			}
			timestamp_value = ImpalaTimestampToTimestamp(Load<Int96>(stats_data));
		} else {
			if (stats.size() != sizeof(int64_t)) {
				throw InvalidInputException("Incorrect stats size for type TIMESTAMP");
			}
			auto val = Load<int64_t>(stats_data);
			switch (schema_ele.type_info) {
			case ParquetExtraTypeInfo::UNIT_MS:
				timestamp_value = Timestamp::FromEpochMs(val);
				break;
			case ParquetExtraTypeInfo::UNIT_NS:
				timestamp_value = Timestamp::FromEpochNanoSeconds(val);
				break;
			case ParquetExtraTypeInfo::UNIT_MICROS:
			default:
				timestamp_value = timestamp_t(val);
				break;
			}
		}
		if (type.id() == LogicalTypeId::TIMESTAMP_TZ) {
			return Value::TIMESTAMPTZ(timestamp_tz_t(timestamp_value));
		}
		return Value::TIMESTAMP(timestamp_value);
	}
	case LogicalTypeId::TIMESTAMP_NS: {
		timestamp_ns_t timestamp_value;
		if (schema_ele.type_info == ParquetExtraTypeInfo::IMPALA_TIMESTAMP) {
			if (stats.size() != sizeof(Int96)) {
				throw InvalidInputException("Incorrect stats size for type TIMESTAMP_NS");
			}
			timestamp_value = ImpalaTimestampToTimestampNS(Load<Int96>(stats_data));
		} else {
			if (stats.size() != sizeof(int64_t)) {
				throw InvalidInputException("Incorrect stats size for type TIMESTAMP_NS");
			}
			auto val = Load<int64_t>(stats_data);
			switch (schema_ele.type_info) {
			case ParquetExtraTypeInfo::UNIT_MS:
				timestamp_value = ParquetTimestampMsToTimestampNs(val);
				break;
			case ParquetExtraTypeInfo::UNIT_NS:
				timestamp_value = ParquetTimestampNsToTimestampNs(val);
				break;
			case ParquetExtraTypeInfo::UNIT_MICROS:
			default:
				timestamp_value = ParquetTimestampUsToTimestampNs(val);
				break;
			}
		}
		return Value::TIMESTAMPNS(timestamp_value);
	}
	case LogicalTypeId::UUID: {
		if (stats.size() != 16) {
			throw InvalidInputException("Incorrect stats size for type UUID");
		}
		auto uuid_val = UUIDValueConversion::ReadParquetUUID(const_data_ptr_cast(stats.c_str()));
		return Value::UUID(uuid_val);
	}
	default:
		throw InternalException("Unsupported type for stats %s", type.ToString());
	}
}